

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O2

void __thiscall
Assimp::ASEImporter::ConvertMeshes
          (ASEImporter *this,Mesh *mesh,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *avOutMeshes)

{
  uint uVar1;
  uint uVar2;
  pointer pFVar3;
  pointer pBVar4;
  pointer paVar5;
  pointer paVar6;
  pointer paVar7;
  pointer paVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  pointer pMVar17;
  uint captainkirk;
  uint uVar18;
  ulong uVar19;
  Logger *pLVar20;
  ulong uVar21;
  ulong uVar22;
  ulong *puVar23;
  aiMesh *paVar24;
  ulong *puVar25;
  ulong *puVar26;
  aiFace *paVar27;
  aiVector3D *paVar28;
  uint *puVar29;
  aiColor4D *paVar30;
  aiBone *paVar31;
  aiVertexWeight *paVar32;
  void *pvVar33;
  aiBone **ppaVar34;
  pointer pMVar35;
  aiFace *paVar36;
  ulong *puVar37;
  uint uVar38;
  long lVar39;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  pointer pBVar40;
  pointer pBVar41;
  uint c;
  pointer ppVar42;
  pointer *ppaVar43;
  long lVar44;
  aiMesh *paVar45;
  aiMesh *p_pcOut;
  aiBone **local_a8;
  ulong *local_a0;
  aiMesh *local_98;
  ulong *local_90;
  pair<unsigned_int,_float> local_88;
  pointer local_80;
  aiBone *local_78;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> vSubMaterials;
  
  uVar21 = (ulong)mesh->iMaterialIndex;
  pMVar35 = (this->mParser->m_vMaterials).
            super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar19 = ((long)(this->mParser->m_vMaterials).
                  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pMVar35) / 0x2e0;
  if (uVar19 <= uVar21) {
    mesh->iMaterialIndex = (int)uVar19 - 1;
    pLVar20 = DefaultLogger::get();
    Logger::warn(pLVar20,"Material index is out of range");
    uVar21 = (ulong)mesh->iMaterialIndex;
    pMVar35 = (this->mParser->m_vMaterials).
              super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  if (*(pointer *)
       &pMVar35[uVar21].avSubMaterials.
        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl ==
      *(pointer *)
       ((long)&pMVar35[uVar21].avSubMaterials.
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl + 8)) {
    paVar24 = (aiMesh *)operator_new(0x520);
    aiMesh::aiMesh(paVar24);
    paVar24->mPrimitiveTypes = 4;
    paVar24->mMaterialIndex = 0xffffffff;
    (this->mParser->m_vMaterials).
    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
    super__Vector_impl_data._M_start[mesh->iMaterialIndex].bNeed = true;
    paVar24->mColors[3] = (aiColor4D *)(ulong)mesh->iMaterialIndex;
    paVar24->mColors[2] = (aiColor4D *)mesh;
    p_pcOut = paVar24;
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(avOutMeshes,&p_pcOut);
    paVar24 = p_pcOut;
    if ((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar5 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (paVar5 != paVar6) {
        p_pcOut->mNumVertices = (uint)(((long)paVar6 - (long)paVar5) / 0xc);
        uVar19 = ((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                       super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x84;
        p_pcOut->mNumFaces = (uint)uVar19;
        uVar19 = uVar19 & 0xffffffff;
        puVar23 = (ulong *)operator_new__(uVar19 * 0x10 + 8);
        *puVar23 = uVar19;
        paVar27 = (aiFace *)(puVar23 + 1);
        if (uVar19 != 0) {
          paVar36 = paVar27;
          do {
            paVar36->mNumIndices = 0;
            paVar36->mIndices = (uint *)0x0;
            paVar36 = paVar36 + 1;
          } while (paVar36 != paVar27 + uVar19);
        }
        paVar24->mFaces = paVar27;
        paVar5 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = SUB168(SEXT816((long)paVar6 - (long)paVar5) / SEXT816(0xc),0);
        uVar19 = SUB168(auVar11 * ZEXT816(0xc),0);
        if (SUB168(auVar11 * ZEXT816(0xc),8) != 0) {
          uVar19 = 0xffffffffffffffff;
        }
        paVar28 = (aiVector3D *)operator_new__(uVar19);
        lVar44 = (long)paVar6 - (long)paVar5;
        if (lVar44 != 0) {
          uVar19 = lVar44 - 0xc;
          memset(paVar28,0,(uVar19 - uVar19 % 0xc) + 0xc);
        }
        paVar24->mVertices = paVar28;
        paVar5 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memcpy(paVar28,paVar5,
               (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar5);
        paVar5 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = SUB168(SEXT816((long)paVar6 - (long)paVar5) / SEXT816(0xc),0);
        uVar19 = SUB168(auVar12 * ZEXT816(0xc),0);
        if (SUB168(auVar12 * ZEXT816(0xc),8) != 0) {
          uVar19 = 0xffffffffffffffff;
        }
        paVar28 = (aiVector3D *)operator_new__(uVar19);
        lVar44 = (long)paVar6 - (long)paVar5;
        if (lVar44 != 0) {
          uVar19 = lVar44 - 0xc;
          memset(paVar28,0,(uVar19 - uVar19 % 0xc) + 0xc);
        }
        paVar24->mNormals = paVar28;
        paVar5 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memcpy(paVar28,paVar5,
               (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar5);
        ppaVar43 = &mesh->amTexCoords[0].
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        for (lVar44 = 0; lVar44 != 0x20; lVar44 = lVar44 + 4) {
          if (((_Vector_impl_data *)(ppaVar43 + -1))->_M_start != *ppaVar43) {
            lVar39 = (long)*ppaVar43 - (long)((_Vector_impl_data *)(ppaVar43 + -1))->_M_start;
            auVar13._8_8_ = 0;
            auVar13._0_8_ = SUB168(SEXT816(lVar39) / SEXT816(0xc),0);
            uVar19 = 0xffffffffffffffff;
            if (SUB168(auVar13 * ZEXT816(0xc),8) == 0) {
              uVar19 = SUB168(auVar13 * ZEXT816(0xc),0);
            }
            pvVar33 = operator_new__(uVar19);
            memset(pvVar33,0,lVar39 - (lVar39 - 0xcU) % 0xc);
            *(void **)((long)p_pcOut->mTextureCoords + lVar44 * 2) = pvVar33;
            memcpy(*(void **)((long)p_pcOut->mTextureCoords + lVar44 * 2),
                   ((_Vector_impl_data *)(ppaVar43 + -1))->_M_start,
                   (long)*ppaVar43 - (long)((_Vector_impl_data *)(ppaVar43 + -1))->_M_start);
            *(undefined4 *)((long)p_pcOut->mNumUVComponents + lVar44) =
                 *(undefined4 *)((long)mesh->mNumUVComponents + lVar44);
          }
          ppaVar43 = ppaVar43 + 3;
        }
        paVar7 = (mesh->mVertexColors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar8 = (mesh->mVertexColors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        paVar24 = p_pcOut;
        if (paVar7 != paVar8) {
          uVar21 = (long)paVar8 - (long)paVar7;
          uVar19 = 0xffffffffffffffff;
          if (-1 < (long)uVar21) {
            uVar19 = uVar21;
          }
          paVar30 = (aiColor4D *)operator_new__(uVar19);
          memset(paVar30,0,(uVar21 - 0x10 & 0xfffffffffffffff0) + 0x10);
          paVar24 = p_pcOut;
          p_pcOut->mColors[0] = paVar30;
          paVar7 = (mesh->mVertexColors).
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                   super__Vector_impl_data._M_start;
          memcpy(paVar30,paVar7,
                 (long)(mesh->mVertexColors).
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar7);
        }
        lVar39 = 0;
        lVar44 = 0;
        for (uVar19 = 0; uVar19 < paVar24->mNumFaces; uVar19 = uVar19 + 1) {
          *(undefined4 *)((long)&paVar24->mFaces->mNumIndices + lVar44) = 3;
          pvVar33 = operator_new__(0xc);
          *(void **)((long)&p_pcOut->mFaces->mIndices + lVar44) = pvVar33;
          **(undefined4 **)((long)&p_pcOut->mFaces->mIndices + lVar44) =
               *(undefined4 *)
                ((long)(((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                         super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                         _M_impl.super__Vector_impl_data._M_start)->super_FaceWithSmoothingGroup).
                       mIndices + lVar39);
          *(undefined4 *)(*(long *)((long)&p_pcOut->mFaces->mIndices + lVar44) + 4) =
               *(undefined4 *)
                ((long)(((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                         super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                         _M_impl.super__Vector_impl_data._M_start)->super_FaceWithSmoothingGroup).
                       mIndices + lVar39 + 4);
          *(undefined4 *)(*(long *)((long)&p_pcOut->mFaces->mIndices + lVar44) + 8) =
               *(undefined4 *)
                ((long)(((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                         super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                         _M_impl.super__Vector_impl_data._M_start)->super_FaceWithSmoothingGroup).
                       mIndices + lVar39 + 8);
          lVar44 = lVar44 + 0x10;
          lVar39 = lVar39 + 0x84;
          paVar24 = p_pcOut;
        }
        pBVar41 = (mesh->mBones).
                  super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pBVar4 = (mesh->mBones).
                 super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((pBVar41 != pBVar4) &&
           ((mesh->mBoneVertices).
            super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (mesh->mBoneVertices).
            super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          std::
          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                    *)&vSubMaterials,(long)pBVar4 - (long)pBVar41 >> 5,(allocator_type *)&local_88);
          uVar18 = 0;
          for (pBVar40 = (mesh->mBoneVertices).
                         super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              paVar45 = (aiMesh *)
                        vSubMaterials.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_start, paVar24 = p_pcOut,
              pBVar40 !=
              (mesh->mBoneVertices).
              super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
              _M_impl.super__Vector_impl_data._M_finish; pBVar40 = pBVar40 + 1) {
            for (ppVar42 = (pBVar40->mBoneWeights).
                           super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppVar42 !=
                (pBVar40->mBoneWeights).
                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish; ppVar42 = ppVar42 + 1) {
              local_88.second = ppVar42->second;
              local_88.first = uVar18;
              std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back
                        ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                         (&((vSubMaterials.
                             super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                             ._M_impl.super__Vector_impl_data._M_start)->super_Material).
                           _vptr_Material + (long)ppVar42->first * 3),(value_type *)&local_88);
            }
            uVar18 = uVar18 + 1;
          }
          p_pcOut->mNumBones = 0;
          uVar18 = 0;
          for (uVar38 = 0; uVar19 = (ulong)uVar38,
              uVar19 < (ulong)((long)(mesh->mBones).
                                     super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(mesh->mBones).
                                     super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar38 = uVar38 + 1) {
            if ((&((vSubMaterials.
                    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                    ._M_impl.super__Vector_impl_data._M_start)->super_Material)._vptr_Material)
                [uVar19 * 3] !=
                (_func_int **)
                (&((vSubMaterials.
                    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                    ._M_impl.super__Vector_impl_data._M_start)->super_Material).mName._M_dataplus)
                [uVar19 * 3]._M_p) {
              uVar18 = uVar18 + 1;
              p_pcOut->mNumBones = uVar18;
            }
          }
          ppaVar34 = (aiBone **)operator_new__((ulong)uVar18 << 3);
          paVar24->mBones = ppaVar34;
          pBVar41 = (mesh->mBones).
                    super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          for (uVar18 = 0; uVar19 = (ulong)uVar18,
              uVar19 < (ulong)((long)(mesh->mBones).
                                     super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar41 >> 5
                              ); uVar18 = uVar18 + 1) {
            local_a0 = (ulong *)(uVar19 * 0x18);
            if (*(long *)((long)local_a0 + (long)(paVar45->mColors + -6)) !=
                *(long *)(&paVar45->mNumFaces + uVar19 * 6)) {
              local_a8 = ppaVar34;
              paVar31 = (aiBone *)operator_new(0x450);
              aiBone::aiBone(paVar31);
              *local_a8 = paVar31;
              pBVar41 = (mesh->mBones).
                        super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              uVar21 = pBVar41[uVar19].mName._M_string_length;
              if (uVar21 < 0x400) {
                (paVar31->mName).length = (ai_uint32)uVar21;
                memcpy((paVar31->mName).data,pBVar41[uVar19].mName._M_dataplus._M_p,uVar21);
                (paVar31->mName).data[uVar21] = '\0';
              }
              local_98 = (aiMesh *)
                         vSubMaterials.
                         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              uVar22 = *(long *)((long)&((vSubMaterials.
                                          super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->super_Material
                                        ).mName._M_dataplus._M_p + (long)local_a0) -
                       *(long *)((long)&((vSubMaterials.
                                          super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->super_Material
                                        )._vptr_Material + (long)local_a0);
              uVar21 = (long)uVar22 >> 3;
              paVar31->mNumWeights = (uint)uVar21;
              uVar21 = uVar21 & 0xffffffff;
              uVar19 = uVar21 * 8;
              local_80 = pBVar41;
              paVar32 = (aiVertexWeight *)operator_new__(uVar19);
              local_78 = paVar31;
              if (uVar21 != 0) {
                memset(paVar32,0,uVar19);
              }
              paVar45 = local_98;
              local_78->mWeights = paVar32;
              memcpy(paVar32,*(void **)((long)local_a0 + (long)local_98),uVar22 & 0x7fffffff8);
              ppaVar34 = local_a8 + 1;
              pBVar41 = local_80;
            }
          }
          std::
          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                     *)&vSubMaterials);
        }
      }
    }
  }
  else {
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::vector
              (&vSubMaterials,&pMVar35[uVar21].avSubMaterials);
    pMVar17 = vSubMaterials.
              super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pMVar35 = vSubMaterials.
              super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar21 = ((long)vSubMaterials.
                    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)vSubMaterials.
                   super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x2e0;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar21;
    uVar22 = SUB168(auVar9 * ZEXT816(0x18),0);
    uVar19 = uVar22 + 8;
    if (0xfffffffffffffff7 < uVar22) {
      uVar19 = 0xffffffffffffffff;
    }
    if (SUB168(auVar9 * ZEXT816(0x18),8) != 0) {
      uVar19 = 0xffffffffffffffff;
    }
    puVar23 = (ulong *)operator_new__(uVar19);
    *puVar23 = uVar21;
    local_90 = puVar23 + 1;
    if (pMVar17 != pMVar35) {
      memset(local_90,0,((uVar22 - 0x18) - (uVar22 - 0x18) % 0x18) + 0x18);
    }
    uVar18 = 0;
    while( true ) {
      p_pcOut = (aiMesh *)CONCAT44(p_pcOut._4_4_,uVar18);
      pFVar3 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
               super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                         super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pFVar3) / 0x84) <=
          (ulong)uVar18) break;
      uVar19 = (ulong)pFVar3[uVar18].iMaterial;
      if (uVar19 < (ulong)(((long)vSubMaterials.
                                  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)vSubMaterials.
                                 super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x2e0)) {
        this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_90 + uVar19 * 3);
      }
      else {
        pLVar20 = DefaultLogger::get();
        Logger::warn(pLVar20,"Submaterial index is out of range");
        this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  (puVar23 +
                  (((long)vSubMaterials.
                          super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)vSubMaterials.
                         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x2e0) * 3 + -2);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (this_00,(value_type_conflict3 *)&p_pcOut);
      uVar18 = (int)p_pcOut + 1;
    }
    local_78 = (aiBone *)mesh->amTexCoords;
    puVar26 = local_90;
    for (ppaVar34 = (aiBone **)0x0;
        ppaVar34 <
        (aiBone **)
        (((long)vSubMaterials.
                super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
                _M_impl.super__Vector_impl_data._M_finish -
         (long)vSubMaterials.
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl.super__Vector_impl_data._M_start) / 0x2e0);
        ppaVar34 = (aiBone **)(ulong)((int)ppaVar34 + 1)) {
      if (puVar26[(long)ppaVar34 * 3] != puVar26[(long)ppaVar34 * 3 + 1]) {
        paVar24 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(paVar24);
        paVar24->mPrimitiveTypes = 4;
        paVar24->mMaterialIndex = (uint)ppaVar34;
        *(undefined1 *)
         (*(long *)&(this->mParser->m_vMaterials).
                    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                    ._M_impl.super__Vector_impl_data._M_start[mesh->iMaterialIndex].avSubMaterials.
                    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                    ._M_impl + 0x2d8 + (long)ppaVar34 * 0x2e0) = 1;
        paVar24->mColors[3] = (aiColor4D *)(ulong)mesh->iMaterialIndex;
        paVar24->mColors[2] = (aiColor4D *)mesh;
        p_pcOut = paVar24;
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(avOutMeshes,&p_pcOut);
        paVar24 = p_pcOut;
        local_a0 = puVar26 + (long)ppaVar34 * 3;
        p_pcOut->mNumVertices = (int)(local_a0[1] - *local_a0 >> 2) * 3;
        uVar18 = (uint)(local_a0[1] - *local_a0 >> 2);
        p_pcOut->mNumFaces = uVar18;
        pBVar41 = (mesh->mBones).
                  super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pBVar4 = (mesh->mBones).
                 super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pBVar41 == pBVar4) {
          puVar25 = (ulong *)0x0;
        }
        else {
          uVar22 = (long)pBVar4 - (long)pBVar41 >> 5;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = uVar22;
          uVar21 = SUB168(auVar10 * ZEXT816(0x18),0);
          uVar19 = uVar21 + 8;
          if (0xfffffffffffffff7 < uVar21) {
            uVar19 = 0xffffffffffffffff;
          }
          if (SUB168(auVar10 * ZEXT816(0x18),8) != 0) {
            uVar19 = 0xffffffffffffffff;
          }
          puVar25 = (ulong *)operator_new__(uVar19);
          *puVar25 = uVar22;
          puVar25 = puVar25 + 1;
          uVar19 = uVar22 * 0x18 - 0x18;
          memset(puVar25,0,(uVar19 - uVar19 % 0x18) + 0x18);
          uVar18 = paVar24->mNumFaces;
        }
        uVar19 = (ulong)uVar18;
        puVar26 = (ulong *)operator_new__(uVar19 * 0x10 + 8);
        *puVar26 = uVar19;
        paVar27 = (aiFace *)(puVar26 + 1);
        if (uVar19 != 0) {
          paVar36 = paVar27;
          do {
            paVar36->mNumIndices = 0;
            paVar36->mIndices = (uint *)0x0;
            paVar36 = paVar36 + 1;
          } while (paVar36 != paVar27 + uVar19);
        }
        paVar24->mFaces = paVar27;
        local_a8 = ppaVar34;
        if ((ulong)paVar24->mNumVertices != 0) {
          uVar19 = (ulong)paVar24->mNumVertices * 0xc;
          paVar28 = (aiVector3D *)operator_new__(uVar19);
          uVar19 = uVar19 - 0xc;
          memset(paVar28,0,(uVar19 - uVar19 % 0xc) + 0xc);
          paVar24->mVertices = paVar28;
          uVar18 = paVar24->mNumVertices;
          uVar19 = (ulong)uVar18 * 0xc;
          paVar28 = (aiVector3D *)operator_new__(uVar19);
          if (uVar18 != 0) {
            uVar19 = uVar19 - 0xc;
            memset(paVar28,0,(uVar19 - uVar19 % 0xc) + 0xc);
          }
          paVar24->mNormals = paVar28;
          uVar38 = 0;
          uVar18 = 0;
          while( true ) {
            uVar19 = (ulong)uVar18;
            if ((ulong)((long)(local_a0[1] - *local_a0) >> 2) <= uVar19) break;
            uVar1 = *(uint *)(*local_a0 + uVar19 * 4);
            puVar29 = (uint *)operator_new__(0xc);
            paVar24 = (aiMesh *)(uVar19 * 0x10);
            p_pcOut->mFaces[uVar19].mIndices = puVar29;
            p_pcOut->mFaces[uVar19].mNumIndices = 3;
            pBVar41 = (pointer)((ulong)uVar1 * 0x84);
            local_98 = paVar24;
            local_80 = pBVar41;
            for (lVar44 = 0; lVar44 != 3; lVar44 = lVar44 + 1) {
              uVar19 = (ulong)*(uint *)((long)&(pBVar41->mName)._M_dataplus._M_p +
                                       (long)((((mesh->
                                                super_MeshWithSmoothingGroups<Assimp::ASE::Face>).
                                                mFaces.
                                                super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super_FaceWithSmoothingGroup).mIndices + lVar44));
              paVar5 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar28 = p_pcOut->mVertices;
              paVar28[uVar38].z = *(float *)((long)(paVar5 + uVar19) + 8);
              paVar5 = paVar5 + uVar19;
              fVar14 = paVar5->y;
              paVar28 = paVar28 + uVar38;
              paVar28->x = paVar5->x;
              paVar28->y = fVar14;
              paVar5 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar28 = p_pcOut->mNormals;
              paVar28[uVar38].z = paVar5[uVar19].z;
              paVar5 = paVar5 + uVar19;
              fVar14 = paVar5->y;
              paVar28 = paVar28 + uVar38;
              paVar28->x = paVar5->x;
              paVar28->y = fVar14;
              if ((mesh->mBones).
                  super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  (mesh->mBones).
                  super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                if (puVar25 == (ulong *)0x0) {
                  __assert_fail("avOutputBones",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/ASE/ASELoader.cpp"
                                ,0x400,
                                "void Assimp::ASEImporter::ConvertMeshes(ASE::Mesh &, std::vector<aiMesh *> &)"
                               );
                }
                pBVar40 = (mesh->mBoneVertices).
                          super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (uVar19 < (ulong)(((long)(mesh->mBoneVertices).
                                            super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pBVar40) / 0x18)) {
                  for (ppVar42 = *(pointer *)
                                  &pBVar40[uVar19].mBoneWeights.
                                   super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                   ._M_impl; pBVar41 = local_80, paVar24 = local_98,
                      ppVar42 !=
                      *(pointer *)
                       ((long)&pBVar40[uVar19].mBoneWeights.
                               super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                               ._M_impl + 8); ppVar42 = ppVar42 + 1) {
                    local_88.second = ppVar42->second;
                    local_88.first = uVar38;
                    std::
                    vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                    ::emplace_back<std::pair<unsigned_int,float>>
                              ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                                *)(puVar25 + (long)ppVar42->first * 3),&local_88);
                    pBVar40 = (mesh->mBoneVertices).
                              super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                }
              }
              *(uint *)(*(long *)((long)&p_pcOut->mFaces->mIndices + (long)paVar24) + lVar44 * 4) =
                   uVar38;
              uVar38 = uVar38 + 1;
            }
            uVar18 = uVar18 + 1;
          }
        }
        ppaVar34 = local_a8;
        for (lVar44 = 0; paVar24 = p_pcOut, lVar44 != 8; lVar44 = lVar44 + 1) {
          if ((((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               ((long)local_78 + lVar44 * 0x18))->
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
              super__Vector_impl_data._M_start !=
              (((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               ((long)local_78 + lVar44 * 0x18))->
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
            local_98 = p_pcOut;
            uVar18 = p_pcOut->mNumVertices;
            uVar19 = (ulong)uVar18 * 0xc;
            paVar28 = (aiVector3D *)operator_new__(uVar19);
            if (uVar18 != 0) {
              uVar19 = uVar19 - 0xc;
              memset(paVar28,0,(uVar19 - uVar19 % 0xc) + 0xc);
            }
            local_98->mTextureCoords[lVar44] = paVar28;
            uVar18 = 0;
            uVar38 = 0;
            while( true ) {
              if ((ulong)((long)(local_a0[1] - *local_a0) >> 2) <= (ulong)uVar38) break;
              uVar1 = *(uint *)(*local_a0 + (ulong)uVar38 * 4);
              for (lVar39 = 0; lVar39 != 3; lVar39 = lVar39 + 1) {
                uVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar1].super_FaceWithSmoothingGroup
                        .mIndices[lVar39];
                paVar5 = (((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          ((long)local_78 + lVar44 * 0x18))->
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
                         ._M_impl.super__Vector_impl_data._M_start;
                paVar28 = p_pcOut->mTextureCoords[lVar44];
                uVar19 = (ulong)uVar18 + lVar39 & 0xffffffff;
                paVar28[uVar19].z = paVar5[uVar2].z;
                paVar5 = paVar5 + uVar2;
                fVar14 = paVar5->y;
                paVar28 = paVar28 + uVar19;
                paVar28->x = paVar5->x;
                paVar28->y = fVar14;
              }
              uVar38 = uVar38 + 1;
              uVar18 = uVar18 + 3;
            }
            p_pcOut->mNumUVComponents[lVar44] = mesh->mNumUVComponents[lVar44];
            ppaVar34 = local_a8;
          }
        }
        if ((mesh->mVertexColors).
            super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (mesh->mVertexColors).
            super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar18 = p_pcOut->mNumVertices;
          uVar19 = (ulong)uVar18 << 4;
          paVar30 = (aiColor4D *)operator_new__(uVar19);
          if (uVar18 != 0) {
            memset(paVar30,0,uVar19);
          }
          paVar24->mColors[0] = paVar30;
          uVar18 = 0;
          uVar38 = 0;
          while( true ) {
            ppaVar34 = local_a8;
            if ((ulong)((long)(local_a0[1] - *local_a0) >> 2) <= (ulong)uVar38) break;
            uVar1 = *(uint *)(*local_a0 + (ulong)uVar38 * 4);
            for (lVar44 = 0; lVar44 != 3; lVar44 = lVar44 + 1) {
              paVar7 = (mesh->mVertexColors).
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start +
                       (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                       super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar1].super_FaceWithSmoothingGroup.
                       mIndices[lVar44];
              fVar14 = paVar7->g;
              fVar15 = paVar7->b;
              fVar16 = paVar7->a;
              paVar30 = paVar24->mColors[0] + ((ulong)uVar18 + lVar44 & 0xffffffff);
              paVar30->r = paVar7->r;
              paVar30->g = fVar14;
              paVar30->b = fVar15;
              paVar30->a = fVar16;
            }
            uVar38 = uVar38 + 1;
            uVar18 = uVar18 + 3;
          }
        }
        paVar24 = p_pcOut;
        puVar26 = local_90;
        if ((mesh->mBones).super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (mesh->mBones).super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          p_pcOut->mNumBones = 0;
          uVar18 = 0;
          for (uVar38 = 0; uVar19 = (ulong)uVar38,
              uVar19 < (ulong)((long)(mesh->mBones).
                                     super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(mesh->mBones).
                                     super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar38 = uVar38 + 1) {
            if (puVar25[uVar19 * 3] != puVar25[uVar19 * 3 + 1]) {
              uVar18 = uVar18 + 1;
              p_pcOut->mNumBones = uVar18;
            }
          }
          local_98 = (aiMesh *)operator_new__((ulong)uVar18 << 3);
          paVar24->mBones = (aiBone **)local_98;
          puVar26 = local_90;
          for (uVar18 = 0; ppaVar34 = local_a8, puVar37 = (ulong *)(ulong)uVar18,
              puVar37 < (ulong *)((long)(mesh->mBones).
                                        super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(mesh->mBones).
                                        super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar18 = uVar18 + 1) {
            if (puVar25[(long)puVar37 * 3] != puVar25[(long)puVar37 * 3 + 1]) {
              local_a0 = puVar37;
              paVar31 = (aiBone *)operator_new(0x450);
              aiBone::aiBone(paVar31);
              *(aiBone **)local_98 = paVar31;
              pBVar41 = (mesh->mBones).
                        super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              uVar19 = pBVar41[(long)local_a0].mName._M_string_length;
              if (uVar19 < 0x400) {
                (paVar31->mName).length = (ai_uint32)uVar19;
                memcpy((paVar31->mName).data,pBVar41[(long)local_a0].mName._M_dataplus._M_p,uVar19);
                (paVar31->mName).data[uVar19] = '\0';
              }
              puVar26 = puVar25 + (long)puVar37 * 3;
              uVar19 = (long)(puVar26[1] - *puVar26) >> 3;
              paVar31->mNumWeights = (uint)uVar19;
              local_80 = (pointer)((uVar19 & 0xffffffff) * 8);
              paVar32 = (aiVertexWeight *)operator_new__((ulong)local_80);
              if ((uVar19 & 0xffffffff) != 0) {
                memset(paVar32,0,(size_t)local_80);
              }
              paVar31->mWeights = paVar32;
              for (uVar21 = 0; uVar21 < (uVar19 & 0xffffffff); uVar21 = uVar21 + 1) {
                uVar19 = *puVar26;
                paVar31->mWeights[uVar21].mVertexId = *(uint *)(uVar19 + uVar21 * 8);
                paVar31->mWeights[uVar21].mWeight = *(float *)(uVar19 + 4 + uVar21 * 8);
                uVar19 = (ulong)paVar31->mNumWeights;
              }
              local_98 = (aiMesh *)&local_98->mNumFaces;
              uVar18 = (uint)local_a0;
              puVar26 = local_90;
            }
          }
          if (puVar25 != (ulong *)0x0) {
            if (puVar25[-1] != 0) {
              lVar44 = puVar25[-1] * 0x18;
              do {
                std::
                _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                 *)((long)puVar25 + lVar44 + -0x18));
                lVar44 = lVar44 + -0x18;
              } while (lVar44 != 0);
            }
            operator_delete__(puVar25 + -1);
            puVar26 = local_90;
          }
        }
      }
    }
    if (*puVar23 != 0) {
      lVar44 = *puVar23 * 0x18;
      do {
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)puVar23 + lVar44 + -0x10));
        lVar44 = lVar44 + -0x18;
      } while (lVar44 != 0);
    }
    operator_delete__(puVar23);
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::~vector
              (&vSubMaterials);
  }
  return;
}

Assistant:

void ASEImporter::ConvertMeshes(ASE::Mesh& mesh, std::vector<aiMesh*>& avOutMeshes)
{
    // validate the material index of the mesh
    if (mesh.iMaterialIndex >= mParser->m_vMaterials.size())    {
        mesh.iMaterialIndex = (unsigned int)mParser->m_vMaterials.size()-1;
        ASSIMP_LOG_WARN("Material index is out of range");
    }

    // If the material the mesh is assigned to is consisting of submeshes, split it
    if (!mParser->m_vMaterials[mesh.iMaterialIndex].avSubMaterials.empty()) {
        std::vector<ASE::Material> vSubMaterials = mParser->
            m_vMaterials[mesh.iMaterialIndex].avSubMaterials;

        std::vector<unsigned int>* aiSplit = new std::vector<unsigned int>[vSubMaterials.size()];

        // build a list of all faces per sub-material
        for (unsigned int i = 0; i < mesh.mFaces.size();++i)    {
            // check range
            if (mesh.mFaces[i].iMaterial >= vSubMaterials.size()) {
                ASSIMP_LOG_WARN("Submaterial index is out of range");

                // use the last material instead
                aiSplit[vSubMaterials.size()-1].push_back(i);
            }
            else aiSplit[mesh.mFaces[i].iMaterial].push_back(i);
        }

        // now generate submeshes
        for (unsigned int p = 0; p < vSubMaterials.size();++p)  {
            if (!aiSplit[p].empty())    {

                aiMesh* p_pcOut = new aiMesh();
                p_pcOut->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

                // let the sub material index
                p_pcOut->mMaterialIndex = p;

                // we will need this material
                mParser->m_vMaterials[mesh.iMaterialIndex].avSubMaterials[p].bNeed = true;

                // store the real index here ... color channel 3
                p_pcOut->mColors[3] = (aiColor4D*)(uintptr_t)mesh.iMaterialIndex;

                // store a pointer to the mesh in color channel 2
                p_pcOut->mColors[2] = (aiColor4D*) &mesh;
                avOutMeshes.push_back(p_pcOut);

                // convert vertices
                p_pcOut->mNumVertices = (unsigned int)aiSplit[p].size()*3;
                p_pcOut->mNumFaces = (unsigned int)aiSplit[p].size();

                // receive output vertex weights
                std::vector<std::pair<unsigned int, float> > *avOutputBones = NULL;
                if (!mesh.mBones.empty())   {
                    avOutputBones = new std::vector<std::pair<unsigned int, float> >[mesh.mBones.size()];
                }

                // allocate enough storage for faces
                p_pcOut->mFaces = new aiFace[p_pcOut->mNumFaces];

                unsigned int iBase = 0,iIndex;
                if (p_pcOut->mNumVertices)  {
                    p_pcOut->mVertices = new aiVector3D[p_pcOut->mNumVertices];
                    p_pcOut->mNormals  = new aiVector3D[p_pcOut->mNumVertices];
                    for (unsigned int q = 0; q < aiSplit[p].size();++q) {

                        iIndex = aiSplit[p][q];

                        p_pcOut->mFaces[q].mIndices = new unsigned int[3];
                        p_pcOut->mFaces[q].mNumIndices = 3;

                        for (unsigned int t = 0; t < 3;++t, ++iBase)    {
                            const uint32_t iIndex2 = mesh.mFaces[iIndex].mIndices[t];

                            p_pcOut->mVertices[iBase] = mesh.mPositions [iIndex2];
                            p_pcOut->mNormals [iBase] = mesh.mNormals   [iIndex2];

                            // convert bones, if existing
                            if (!mesh.mBones.empty()) {
                                ai_assert(avOutputBones);
                                // check whether there is a vertex weight for this vertex index
                                if (iIndex2 < mesh.mBoneVertices.size())    {

                                    for (std::vector<std::pair<int,float> >::const_iterator
                                        blubb =  mesh.mBoneVertices[iIndex2].mBoneWeights.begin();
                                        blubb != mesh.mBoneVertices[iIndex2].mBoneWeights.end();++blubb)    {

                                        // NOTE: illegal cases have already been filtered out
                                        avOutputBones[(*blubb).first].push_back(std::pair<unsigned int, float>(
                                            iBase,(*blubb).second));
                                    }
                                }
                            }
                            p_pcOut->mFaces[q].mIndices[t] = iBase;
                        }
                    }
                }
                // convert texture coordinates (up to AI_MAX_NUMBER_OF_TEXTURECOORDS sets supported)
                for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                    if (!mesh.amTexCoords[c].empty())
                    {
                        p_pcOut->mTextureCoords[c] = new aiVector3D[p_pcOut->mNumVertices];
                        iBase = 0;
                        for (unsigned int q = 0; q < aiSplit[p].size();++q) {
                            iIndex = aiSplit[p][q];
                            for (unsigned int t = 0; t < 3;++t) {
                                p_pcOut->mTextureCoords[c][iBase++] = mesh.amTexCoords[c][mesh.mFaces[iIndex].mIndices[t]];
                            }
                        }
                        // Setup the number of valid vertex components
                        p_pcOut->mNumUVComponents[c] = mesh.mNumUVComponents[c];
                    }
                }

                // Convert vertex colors (only one set supported)
                if (!mesh.mVertexColors.empty()){
                    p_pcOut->mColors[0] = new aiColor4D[p_pcOut->mNumVertices];
                    iBase = 0;
                    for (unsigned int q = 0; q < aiSplit[p].size();++q) {
                        iIndex = aiSplit[p][q];
                        for (unsigned int t = 0; t < 3;++t) {
                            p_pcOut->mColors[0][iBase++] = mesh.mVertexColors[mesh.mFaces[iIndex].mIndices[t]];
                        }
                    }
                }
                // Copy bones
                if (!mesh.mBones.empty())   {
                    p_pcOut->mNumBones = 0;
                    for (unsigned int mrspock = 0; mrspock < mesh.mBones.size();++mrspock)
                        if (!avOutputBones[mrspock].empty())p_pcOut->mNumBones++;

                    p_pcOut->mBones = new aiBone* [ p_pcOut->mNumBones ];
                    aiBone** pcBone = p_pcOut->mBones;
                    for (unsigned int mrspock = 0; mrspock < mesh.mBones.size();++mrspock)
                    {
                        if (!avOutputBones[mrspock].empty())    {
                            // we will need this bone. add it to the output mesh and
                            // add all per-vertex weights
                            aiBone* pc = *pcBone = new aiBone();
                            pc->mName.Set(mesh.mBones[mrspock].mName);

                            pc->mNumWeights = (unsigned int)avOutputBones[mrspock].size();
                            pc->mWeights = new aiVertexWeight[pc->mNumWeights];

                            for (unsigned int captainkirk = 0; captainkirk < pc->mNumWeights;++captainkirk)
                            {
                                const std::pair<unsigned int,float>& ref = avOutputBones[mrspock][captainkirk];
                                pc->mWeights[captainkirk].mVertexId = ref.first;
                                pc->mWeights[captainkirk].mWeight = ref.second;
                            }
                            ++pcBone;
                        }
                    }
                    // delete allocated storage
                    delete[] avOutputBones;
                }
            }
        }
        // delete storage
        delete[] aiSplit;
    }
    else
    {
        // Otherwise we can simply copy the data to one output mesh
        // This codepath needs less memory and uses fast memcpy()s
        // to do the actual copying. So I think it is worth the
        // effort here.

        aiMesh* p_pcOut = new aiMesh();
        p_pcOut->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        // set an empty sub material index
        p_pcOut->mMaterialIndex = ASE::Face::DEFAULT_MATINDEX;
        mParser->m_vMaterials[mesh.iMaterialIndex].bNeed = true;

        // store the real index here ... in color channel 3
        p_pcOut->mColors[3] = (aiColor4D*)(uintptr_t)mesh.iMaterialIndex;

        // store a pointer to the mesh in color channel 2
        p_pcOut->mColors[2] = (aiColor4D*) &mesh;
        avOutMeshes.push_back(p_pcOut);

        // If the mesh hasn't faces or vertices, there are two cases
        // possible: 1. the model is invalid. 2. This is a dummy
        // helper object which we are going to remove later ...
        if (mesh.mFaces.empty() || mesh.mPositions.empty()) {
            return;
        }

        // convert vertices
        p_pcOut->mNumVertices = (unsigned int)mesh.mPositions.size();
        p_pcOut->mNumFaces = (unsigned int)mesh.mFaces.size();

        // allocate enough storage for faces
        p_pcOut->mFaces = new aiFace[p_pcOut->mNumFaces];

        // copy vertices
        p_pcOut->mVertices = new aiVector3D[mesh.mPositions.size()];
        memcpy(p_pcOut->mVertices,&mesh.mPositions[0],
            mesh.mPositions.size() * sizeof(aiVector3D));

        // copy normals
        p_pcOut->mNormals = new aiVector3D[mesh.mNormals.size()];
        memcpy(p_pcOut->mNormals,&mesh.mNormals[0],
            mesh.mNormals.size() * sizeof(aiVector3D));

        // copy texture coordinates
        for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c)    {
            if (!mesh.amTexCoords[c].empty())   {
                p_pcOut->mTextureCoords[c] = new aiVector3D[mesh.amTexCoords[c].size()];
                memcpy(p_pcOut->mTextureCoords[c],&mesh.amTexCoords[c][0],
                    mesh.amTexCoords[c].size() * sizeof(aiVector3D));

                // setup the number of valid vertex components
                p_pcOut->mNumUVComponents[c] = mesh.mNumUVComponents[c];
            }
        }

        // copy vertex colors
        if (!mesh.mVertexColors.empty())    {
            p_pcOut->mColors[0] = new aiColor4D[mesh.mVertexColors.size()];
            memcpy(p_pcOut->mColors[0],&mesh.mVertexColors[0],
                mesh.mVertexColors.size() * sizeof(aiColor4D));
        }

        // copy faces
        for (unsigned int iFace = 0; iFace < p_pcOut->mNumFaces;++iFace)    {
            p_pcOut->mFaces[iFace].mNumIndices = 3;
            p_pcOut->mFaces[iFace].mIndices = new unsigned int[3];

            // copy indices
            p_pcOut->mFaces[iFace].mIndices[0] = mesh.mFaces[iFace].mIndices[0];
            p_pcOut->mFaces[iFace].mIndices[1] = mesh.mFaces[iFace].mIndices[1];
            p_pcOut->mFaces[iFace].mIndices[2] = mesh.mFaces[iFace].mIndices[2];
        }

        // copy vertex bones
        if (!mesh.mBones.empty() && !mesh.mBoneVertices.empty())    {
            std::vector<std::vector<aiVertexWeight> > avBonesOut( mesh.mBones.size() );

            // find all vertex weights for this bone
            unsigned int quak = 0;
            for (std::vector<BoneVertex>::const_iterator harrypotter =  mesh.mBoneVertices.begin();
                harrypotter != mesh.mBoneVertices.end();++harrypotter,++quak)   {

                for (std::vector<std::pair<int,float> >::const_iterator
                    ronaldweasley  = (*harrypotter).mBoneWeights.begin();
                    ronaldweasley != (*harrypotter).mBoneWeights.end();++ronaldweasley)
                {
                    aiVertexWeight weight;
                    weight.mVertexId = quak;
                    weight.mWeight = (*ronaldweasley).second;
                    avBonesOut[(*ronaldweasley).first].push_back(weight);
                }
            }

            // now build a final bone list
            p_pcOut->mNumBones = 0;
            for (unsigned int jfkennedy = 0; jfkennedy < mesh.mBones.size();++jfkennedy)
                if (!avBonesOut[jfkennedy].empty())p_pcOut->mNumBones++;

            p_pcOut->mBones = new aiBone*[p_pcOut->mNumBones];
            aiBone** pcBone = p_pcOut->mBones;
            for (unsigned int jfkennedy = 0; jfkennedy < mesh.mBones.size();++jfkennedy)    {
                if (!avBonesOut[jfkennedy].empty()) {
                    aiBone* pc = *pcBone = new aiBone();
                    pc->mName.Set(mesh.mBones[jfkennedy].mName);
                    pc->mNumWeights = (unsigned int)avBonesOut[jfkennedy].size();
                    pc->mWeights = new aiVertexWeight[pc->mNumWeights];
                    ::memcpy(pc->mWeights,&avBonesOut[jfkennedy][0],
                        sizeof(aiVertexWeight) * pc->mNumWeights);
                    ++pcBone;
                }
            }
        }
    }
}